

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TransitionObservationIndependentMADPDiscrete.cpp
# Opt level: O1

string * __thiscall
TransitionObservationIndependentMADPDiscrete::SoftPrintActionSets_abi_cxx11_
          (string *__return_storage_ptr__,TransitionObservationIndependentMADPDiscrete *this)

{
  char cVar1;
  ostream *poVar2;
  ulong uVar3;
  ActionDiscrete *pAVar4;
  undefined8 *puVar5;
  ulong uVar6;
  ulong uVar7;
  stringstream ss;
  stringstream str;
  long *local_340;
  long local_338;
  long local_330 [47];
  stringstream local_1b8 [16];
  long local_1a8 [14];
  ios_base local_138 [264];
  
  std::__cxx11::stringstream::stringstream(local_1b8);
  if (this->_m_initialized != false) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"Actions:",8);
    cVar1 = (char)(ostream *)local_1a8;
    std::ios::widen((char)*(undefined8 *)(local_1a8[0] + -0x18) + cVar1);
    std::ostream::put(cVar1);
    std::ostream::flush();
    if ((this->super_MultiAgentDecisionProcess)._m_nrAgents != 0) {
      uVar6 = 0;
      do {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"agentI ",7);
        poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
        std::__ostream_insert<char,std::char_traits<char>>(poVar2," - nrActions ",0xd);
        (**(code **)(*(long *)&this->super_MultiAgentDecisionProcess + 0x48))(this,uVar6);
        poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
        std::ostream::put((char)poVar2);
        std::ostream::flush();
        uVar7 = 0;
        while( true ) {
          uVar3 = (**(code **)(*(long *)&this->super_MultiAgentDecisionProcess + 0x48))(this);
          if (uVar3 <= uVar7) break;
          pAVar4 = MADPComponentDiscreteActions::GetActionDiscrete
                             (&(this->_m_individualMADPDs).
                               super__Vector_base<MultiAgentDecisionProcessDiscrete_*,_std::allocator<MultiAgentDecisionProcessDiscrete_*>_>
                               ._M_impl.super__Vector_impl_data._M_start[uVar6]->_m_A,0,(Index)uVar7
                             );
          (*(pAVar4->super_Action).super_NamedDescribedEntity._vptr_NamedDescribedEntity[2])
                    (&local_340,pAVar4);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_1a8,(char *)local_340,local_338);
          if (local_340 != local_330) {
            operator_delete(local_340,local_330[0] + 1);
          }
          std::ios::widen((char)*(undefined8 *)(local_1a8[0] + -0x18) + cVar1);
          std::ostream::put(cVar1);
          std::ostream::flush();
          uVar7 = (ulong)((Index)uVar7 + 1);
        }
        uVar6 = (ulong)((int)uVar6 + 1);
      } while (uVar6 < (this->super_MultiAgentDecisionProcess)._m_nrAgents);
    }
    std::__cxx11::stringbuf::str();
    std::__cxx11::stringstream::~stringstream(local_1b8);
    std::ios_base::~ios_base(local_138);
    return __return_storage_ptr__;
  }
  std::__cxx11::stringstream::stringstream((stringstream *)&local_340);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_330,"TransitionObservationIndependentMADPDiscrete::PrintAction",0x39);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_330,"Sets() - Error: not initialized. ",0x21);
  std::endl<char,std::char_traits<char>>((ostream *)local_330);
  puVar5 = (undefined8 *)__cxa_allocate_exception(0x28);
  *puVar5 = &PTR__E_0059bd80;
  std::__cxx11::stringbuf::str();
  __cxa_throw(puVar5,&E::typeinfo,E::~E);
}

Assistant:

string TransitionObservationIndependentMADPDiscrete::SoftPrintActionSets() const
{
    stringstream str;
    if(!_m_initialized)
    {
        stringstream ss;
            ss << "TransitionObservationIndependentMADPDiscrete::PrintAction"<<
                "Sets() - Error: not initialized. "<<endl;
        throw E(ss);
    }    
    str << "Actions:"<<endl;
    for(Index agentIndex=0; agentIndex < _m_nrAgents; agentIndex++)
    {
        str << "agentI " << agentIndex << " - nrActions " << 
            GetNrActions(agentIndex)<<endl; 
        for(Index actionI=0; actionI < GetNrActions(agentIndex); actionI++)
        {

            const ActionDiscrete * adp = GetIndividualMADPD(agentIndex)->
                GetActionDiscrete(0, actionI);
            str << adp->SoftPrint();
            str << endl;
        }
    }
    return(str.str());
}